

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fSamplerStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::SamplerStateQueryTests::init
          (SamplerStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  char *pcVar1;
  TestNode *node;
  SamplerStateQueryTests *pSVar2;
  allocator<char> local_b1;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  QueryType local_1c;
  int local_18;
  QueryType verifier;
  int _verifierNdx;
  int stateNdx;
  SamplerStateQueryTests *this_local;
  
  verifier = QUERY_BOOLEAN;
  pSVar2 = this;
  __verifierNdx = this;
  while ((int)verifier < 9) {
    for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
      local_1c = init::verifiers[local_18];
      testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      renderCtx = Context::getRenderContext((this->super_TestCaseGroup).m_context);
      std::__cxx11::string::string((string *)&local_80);
      std::operator+(&local_60,&local_80,init::states[(int)verifier].name);
      pcVar1 = getVerifierSuffix(local_1c);
      std::operator+(&local_40,&local_60,pcVar1);
      pcVar1 = init::states[(int)verifier].desc;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,pcVar1,&local_b1);
      node = &deqp::gls::TextureStateQueryTests::createSamplerParamTest
                        (testCtx,renderCtx,&local_40,&local_b0,local_1c,
                         init::states[(int)verifier].tester)->super_TestNode;
      tcu::TestNode::addChild((TestNode *)this,node);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
    }
    verifier = verifier + QUERY_BOOLEAN_VEC4;
    pSVar2 = (SamplerStateQueryTests *)(ulong)verifier;
  }
  return (int)pSVar2;
}

Assistant:

void SamplerStateQueryTests::init (void)
{
	using namespace gls::TextureStateQueryTests;

	static const QueryType verifiers[] =
	{
		QUERY_SAMPLER_PARAM_INTEGER,
		QUERY_SAMPLER_PARAM_FLOAT
	};
	static const struct
	{
		const char*	name;
		const char*	desc;
		TesterType	tester;
	} states[] =
	{
		{ "sampler_texture_wrap_s",				"TEXTURE_WRAP_S",			TESTER_TEXTURE_WRAP_S			},
		{ "sampler_texture_wrap_t",				"TEXTURE_WRAP_T",			TESTER_TEXTURE_WRAP_T			},
		{ "sampler_texture_wrap_r",				"TEXTURE_WRAP_R",			TESTER_TEXTURE_WRAP_R			},
		{ "sampler_texture_mag_filter",			"TEXTURE_MAG_FILTER",		TESTER_TEXTURE_MAG_FILTER		},
		{ "sampler_texture_min_filter",			"TEXTURE_MIN_FILTER",		TESTER_TEXTURE_MIN_FILTER		},
		{ "sampler_texture_min_lod",			"TEXTURE_MIN_LOD",			TESTER_TEXTURE_MIN_LOD			},
		{ "sampler_texture_max_lod",			"TEXTURE_MAX_LOD",			TESTER_TEXTURE_MAX_LOD			},
		{ "sampler_texture_compare_mode",		"TEXTURE_COMPARE_MODE",		TESTER_TEXTURE_COMPARE_MODE		},
		{ "sampler_texture_compare_func",		"TEXTURE_COMPARE_FUNC",		TESTER_TEXTURE_COMPARE_FUNC		},
	};

	for (int stateNdx = 0; stateNdx < DE_LENGTH_OF_ARRAY(states); ++stateNdx)
	{
		FOR_EACH_VERIFIER(verifiers, addChild(createSamplerParamTest(m_testCtx,
																	 m_context.getRenderContext(),
																	 std::string() + states[stateNdx].name + getVerifierSuffix(verifier),
																	 states[stateNdx].desc,
																	 verifier,
																	 states[stateNdx].tester)));
	}
}